

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OctoquadIdentifier.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::OctoquadIdentifier::SetTrigramAlphabet
          (OctoquadIdentifier *this,ScriptContext *scriptContext,char *alpha,char *alphaBits)

{
  TrigramAlphabet *this_00;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *alloc_00;
  uint local_78;
  uint local_74;
  uint i_1;
  uint i;
  TrackAllocData local_60;
  TrigramAlphabet *local_38;
  TrigramAlphabet *trigramAlphabet;
  ArenaAllocator *alloc;
  char *alphaBits_local;
  char *alpha_local;
  ScriptContext *scriptContext_local;
  OctoquadIdentifier *this_local;
  
  alloc = (ArenaAllocator *)alphaBits;
  alphaBits_local = alpha;
  alpha_local = (char *)scriptContext;
  scriptContext_local = (ScriptContext *)this;
  this_00 = (TrigramAlphabet *)Js::ScriptContext::RegexAllocator(scriptContext);
  trigramAlphabet = this_00;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_60,(type_info *)&TrigramAlphabet::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/OctoquadIdentifier.cpp"
             ,0xf9);
  alloc_00 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            this_00,&local_60);
  local_38 = (TrigramAlphabet *)
             new<Memory::ArenaAllocator>(0x3378,(ArenaAllocator *)alloc_00,0x3f67b0);
  for (local_74 = 0; local_74 < 0x80; local_74 = local_74 + 1) {
    local_38->alphaBits[local_74] = '\x04';
  }
  for (local_78 = 0; local_78 < 4; local_78 = local_78 + 1) {
    local_38->alpha[local_78] = alphaBits_local[local_78];
    local_38->alphaBits[alphaBits_local[local_78]] =
         *(char *)((long)&(alloc->
                          super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>).
                          super_Allocator.outOfMemoryFunc + (long)alphaBits_local[local_78]);
  }
  TrigramAlphabet::InitTrigramMap(local_38);
  Js::ScriptContext::SetTrigramAlphabet((ScriptContext *)alpha_local,local_38);
  return;
}

Assistant:

void OctoquadIdentifier::SetTrigramAlphabet(Js::ScriptContext * scriptContext,
        __in_xcount(regex::TrigramAlphabet::AlphaCount) char* alpha
        , __in_xcount(regex::TrigramAlphabet::AsciiTableSize) char* alphaBits)
    {
        ArenaAllocator* alloc = scriptContext->RegexAllocator();
        TrigramAlphabet * trigramAlphabet = AnewStruct(alloc, UnifiedRegex::TrigramAlphabet);
        for (uint i = 0; i < UnifiedRegex::TrigramAlphabet::AsciiTableSize; i++) {
            trigramAlphabet->alphaBits[i] = UnifiedRegex::TrigramAlphabet::BitsNotInAlpha;
        }
        for (uint i = 0; i < UnifiedRegex::TrigramAlphabet::AlphaCount; i++) {
            trigramAlphabet->alpha[i] = alpha[i];
            trigramAlphabet->alphaBits[alpha[i]] = alphaBits[alpha[i]];
        }
        trigramAlphabet->InitTrigramMap();
        scriptContext->SetTrigramAlphabet(trigramAlphabet);
    }